

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O3

void beltKeyExpand(octet *key_,octet *key,size_t len)

{
  u32 *w;
  
  memMove(key_,key,len);
  if (len == 0x18) {
    *(uint *)(key_ + 0x18) = *(uint *)(key_ + 4) ^ *(uint *)key_ ^ *(uint *)(key_ + 8);
    *(uint *)(key_ + 0x1c) = *(uint *)(key_ + 0x10) ^ *(uint *)(key_ + 0xc) ^ *(uint *)(key_ + 0x14)
    ;
  }
  else if (len == 0x10) {
    memCopy(key_ + 0x10,key_,0x10);
    return;
  }
  return;
}

Assistant:

void beltKeyExpand(octet key_[32], const octet key[], size_t len)
{
	ASSERT(memIsValid(key_, 32));
	ASSERT(len == 16 || len == 24 || len == 32);
	ASSERT(memIsValid(key, len));
	memMove(key_, key, len);
	if (len == 16)
		memCopy(key_ + 16, key_, 16);
	else if (len == 24)
	{
		u32* w = (u32*)key_;
		w[6] = w[0] ^ w[1] ^ w[2];
		w[7] = w[3] ^ w[4] ^ w[5];
	}
}